

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalCast.h
# Opt level: O0

enable_if_t<std::is_arithmetic<unsigned_long>::value,_bool> __thiscall
beast::detail::LexicalCast<std::__cxx11::string,unsigned_long>::operator()
          (void *this,string *out,unsigned_long in)

{
  string local_40;
  unsigned_long local_20;
  unsigned_long in_local;
  string *out_local;
  LexicalCast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *this_local;
  
  local_20 = in;
  in_local = (unsigned_long)out;
  out_local = (string *)this;
  std::__cxx11::to_string(&local_40,in);
  std::__cxx11::string::operator=((string *)in_local,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return true;
}

Assistant:

std::enable_if_t <std::is_arithmetic <Arithmetic>::value, bool>
    operator () (std::string& out, Arithmetic in)
    {
        out = std::to_string (in);
        return true;
    }